

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckEqualsWithStringsWorksOnContentsWithALiteral::RunImpl
          (TestCheckEqualsWithStringsWorksOnContentsWithALiteral *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_88;
  int local_64 [5];
  TestDetails local_50;
  undefined1 local_30 [8];
  TestResults results;
  char *p1;
  TestCheckEqualsWithStringsWorksOnContentsWithALiteral *this_local;
  
  results._16_8_ = (anonymous_namespace)::txt1;
  UnitTest::TestResults::TestResults((TestResults *)local_30,(TestReporter *)0x0);
  UnitTest::TestDetails::TestDetails(&local_50,"","","",0);
  UnitTest::CheckEqual((TestResults *)local_30,"Hello",(anonymous_namespace)::txt1,&local_50);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_64[1] = 0;
  local_64[0] = UnitTest::TestResults::GetFailureCount((TestResults *)local_30);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_88,*ppTVar2,0x46);
  UnitTest::CheckEqual<int,int>(results_00,local_64 + 1,local_64,&local_88);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsWorksOnContentsWithALiteral)
{
    char const* const p1 = txt1;
    TestResults results;
    CheckEqual(results, "Hello", p1, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}